

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O2

ssize_t __thiscall
Imf_3_2::anon_unknown_0::PtrIStream::read(PtrIStream *this,int __fd,void *__buf,size_t __nbytes)

{
  char *pcVar1;
  void *pvVar2;
  ostream *poVar3;
  InputExc *pIVar4;
  ulong __n;
  undefined4 in_register_00000034;
  stringstream _iex_throw_s;
  ostream local_190 [376];
  
  __n = (ulong)__buf & 0xffffffff;
  if ((int)__buf < 0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    poVar3 = (ostream *)std::ostream::operator<<(local_190,(int)__buf);
    std::operator<<(poVar3," bytes requested from stream");
    pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
    Iex_3_2::InputExc::InputExc(pIVar4,(stringstream *)&_iex_throw_s);
    __cxa_throw(pIVar4,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
  }
  if (this->current + __n <= this->end) {
    pvVar2 = memcpy((void *)CONCAT44(in_register_00000034,__fd),this->current,__n);
    pcVar1 = this->current;
    this->current = pcVar1 + __n;
    return CONCAT71((int7)((ulong)pvVar2 >> 8),pcVar1 + __n != this->end);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
  poVar3 = std::operator<<(local_190,"Early end of file: requesting ");
  poVar3 = std::ostream::_M_insert<long>((long)poVar3);
  std::operator<<(poVar3," extra bytes after file\n");
  pIVar4 = (InputExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::InputExc::InputExc(pIVar4,(stringstream *)&_iex_throw_s);
  __cxa_throw(pIVar4,&Iex_3_2::InputExc::typeinfo,Iex_3_2::InputExc::~InputExc);
}

Assistant:

virtual bool read (char c[/*n*/], int n)
    {
        if (n < 0)
        {
            THROW (
                IEX_NAMESPACE::InputExc, n << " bytes requested from stream");
        }

        if (n + current > end)
        {
            THROW (
                IEX_NAMESPACE::InputExc,
                "Early end of file: requesting "
                    << end - (n + current) << " extra bytes after file\n");
        }
        memcpy (c, current, n);
        current += n;

        return (current != end);
    }